

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioManager.c
# Opt level: O0

void AudioManagerInit(void)

{
  AudioSource *in_stack_00000028;
  char *in_stack_00000030;
  
  VxSndInit();
  VxSndLoadSound(in_stack_00000030,in_stack_00000028);
  VxSndLoadSound(in_stack_00000030,in_stack_00000028);
  VxSndLoadSound(in_stack_00000030,in_stack_00000028);
  VxSndLoadSound(in_stack_00000030,in_stack_00000028);
  VxSndLoadSound(in_stack_00000030,in_stack_00000028);
  VxSndLoadSound(in_stack_00000030,in_stack_00000028);
  if (((ambientAudio.loaded & 1U) == 0) || ((sandSpawnAudio.loaded & 1U) == 0)) {
    fprintf(_stderr,"Can\'t load music!\n");
  }
  return;
}

Assistant:

void AudioManagerInit() {
#ifdef UNIX
    clock_gettime(CLOCK_MONOTONIC, &start);
    clock_gettime(CLOCK_MONOTONIC, &finish);
#endif
    VxSndInit();
    VxSndLoadSound("data/sound/ambient.mp3", &ambientAudio);
    VxSndLoadSound("data/sound/sand_spawn.mp3", &sandSpawnAudio);
    VxSndLoadSound("data/sound/water_spawn.mp3", &waterSpawnAudio);
    VxSndLoadSound("data/sound/fire_spawn.mp3", &fireSpawnAudio);
    VxSndLoadSound("data/sound/stone_spawn.mp3", &stoneSpawnAudio);
    VxSndLoadSound("data/sound/plant_spawn.mp3", &plantSpawnAudio);
    if (!ambientAudio.loaded || !sandSpawnAudio.loaded) {
        fprintf(stderr, "Can't load music!\n");
    }
}